

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_lpf1_process_pcm_frames
                    (ma_lpf1 *pLPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  void *local_c0;
  ma_int16 *pX_1;
  ma_int16 *pY_1;
  float *pX;
  float *pY;
  ma_uint32 n;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_lpf1 *pLPF_local;
  float y;
  float x;
  float r1;
  float b;
  float a;
  ma_uint32 channels;
  ma_uint32 c;
  ma_int32 y_1;
  ma_int32 x_1;
  ma_int32 r1_1;
  ma_int32 b_1;
  ma_int32 a_1;
  ma_uint32 channels_1;
  ma_uint32 c_1;
  
  if (((pLPF == (ma_lpf1 *)0x0) || (pFramesOut == (void *)0x0)) || (pFramesIn == (void *)0x0)) {
    pLPF_local._0_4_ = MA_INVALID_ARGS;
  }
  else {
    if (pLPF->format == ma_format_f32) {
      pY_1 = (ma_int16 *)pFramesIn;
      pX = (float *)pFramesOut;
      for (pY._4_4_ = 0; pY._4_4_ < frameCount; pY._4_4_ = pY._4_4_ + 1) {
        fVar2 = (float)pLPF->channels;
        fVar1 = (pLPF->a).f32;
        for (a = 0.0; (uint)a < (uint)fVar2; a = (float)((int)a + 1)) {
          fVar6 = (1.0 - fVar1) * *(float *)(pY_1 + (ulong)(uint)a * 2) +
                  fVar1 * pLPF->pR1[(uint)a].f32;
          pX[(uint)a] = fVar6;
          pLPF->pR1[(uint)a].f32 = fVar6;
        }
        pX = pX + pLPF->channels;
        pY_1 = pY_1 + (ulong)pLPF->channels * 2;
      }
    }
    else {
      if (pLPF->format != ma_format_s16) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x82de,
                      "ma_result ma_lpf1_process_pcm_frames(ma_lpf1 *, void *, const void *, ma_uint64)"
                     );
      }
      local_c0 = pFramesIn;
      pX_1 = (ma_int16 *)pFramesOut;
      for (pY._4_4_ = 0; pY._4_4_ < frameCount; pY._4_4_ = pY._4_4_ + 1) {
        uVar3 = pLPF->channels;
        iVar4 = (pLPF->a).s32;
        for (a_1 = 0; (uint)a_1 < uVar3; a_1 = a_1 + 1) {
          iVar5 = (0x4000 - iVar4) * (int)*(short *)((long)local_c0 + (ulong)(uint)a_1 * 2) +
                  iVar4 * pLPF->pR1[(uint)a_1].s32 >> 0xe;
          pX_1[(uint)a_1] = (ma_int16)iVar5;
          pLPF->pR1[(uint)a_1].s32 = iVar5;
        }
        pX_1 = pX_1 + pLPF->channels;
        local_c0 = (void *)((long)local_c0 + (ulong)pLPF->channels * 2);
      }
    }
    pLPF_local._0_4_ = MA_SUCCESS;
  }
  return (ma_result)pLPF_local;
}

Assistant:

MA_API ma_result ma_lpf1_process_pcm_frames(ma_lpf1* pLPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pLPF == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pLPF->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_lpf1_process_pcm_frame_f32(pLPF, pY, pX);
            pY += pLPF->channels;
            pX += pLPF->channels;
        }
    } else if (pLPF->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_lpf1_process_pcm_frame_s16(pLPF, pY, pX);
            pY += pLPF->channels;
            pX += pLPF->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}